

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall
tinyxml2::XMLNode::InsertAfterChild(XMLNode *this,XMLNode *afterThis,XMLNode *addThis)

{
  XMLNode *addThis_local;
  XMLNode *afterThis_local;
  XMLNode *this_local;
  
  if (addThis->_document == this->_document) {
    if (afterThis->_parent == this) {
      if (afterThis->_next == (XMLNode *)0x0) {
        this_local = InsertEndChild(this,addThis);
      }
      else {
        InsertChildPreamble(this,addThis);
        addThis->_prev = afterThis;
        addThis->_next = afterThis->_next;
        afterThis->_next->_prev = addThis;
        afterThis->_next = addThis;
        addThis->_parent = this;
        this_local = addThis;
      }
    }
    else {
      this_local = (XMLNode *)0x0;
    }
  }
  else {
    this_local = (XMLNode *)0x0;
  }
  return this_local;
}

Assistant:

XMLNode* XMLNode::InsertAfterChild( XMLNode* afterThis, XMLNode* addThis )
{
    TIXMLASSERT( addThis );
    if ( addThis->_document != _document ) {
        TIXMLASSERT( false );
        return 0;
    }

    TIXMLASSERT( afterThis );

    if ( afterThis->_parent != this ) {
        TIXMLASSERT( false );
        return 0;
    }

    if ( afterThis->_next == 0 ) {
        // The last node or the only node.
        return InsertEndChild( addThis );
    }
    InsertChildPreamble( addThis );
    addThis->_prev = afterThis;
    addThis->_next = afterThis->_next;
    afterThis->_next->_prev = addThis;
    afterThis->_next = addThis;
    addThis->_parent = this;
    return addThis;
}